

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

void __thiscall
CS248::HalfedgeMesh::rebuild
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_> *vertexPositions)

{
  list<CS248::Vertex,_std::allocator<CS248::Vertex>_> *this_00;
  list<CS248::Edge,_std::allocator<CS248::Edge>_> *this_01;
  list<CS248::Face,_std::allocator<CS248::Face>_> *plVar1;
  
  std::__cxx11::_List_base<CS248::Halfedge,_std::allocator<CS248::Halfedge>_>::_M_clear
            ((_List_base<CS248::Halfedge,_std::allocator<CS248::Halfedge>_> *)this);
  (this->halfedges).super__List_base<CS248::Halfedge,_std::allocator<CS248::Halfedge>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->halfedges).super__List_base<CS248::Halfedge,_std::allocator<CS248::Halfedge>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->halfedges).super__List_base<CS248::Halfedge,_std::allocator<CS248::Halfedge>_>._M_impl.
  _M_node._M_size = 0;
  this_00 = &this->vertices;
  std::__cxx11::_List_base<CS248::Vertex,_std::allocator<CS248::Vertex>_>::_M_clear
            (&this_00->super__List_base<CS248::Vertex,_std::allocator<CS248::Vertex>_>);
  (this->vertices).super__List_base<CS248::Vertex,_std::allocator<CS248::Vertex>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->vertices).super__List_base<CS248::Vertex,_std::allocator<CS248::Vertex>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->vertices).super__List_base<CS248::Vertex,_std::allocator<CS248::Vertex>_>._M_impl._M_node.
  _M_size = 0;
  this_01 = &this->edges;
  std::__cxx11::_List_base<CS248::Edge,_std::allocator<CS248::Edge>_>::_M_clear
            (&this_01->super__List_base<CS248::Edge,_std::allocator<CS248::Edge>_>);
  (this->edges).super__List_base<CS248::Edge,_std::allocator<CS248::Edge>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_01;
  (this->edges).super__List_base<CS248::Edge,_std::allocator<CS248::Edge>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_01;
  (this->edges).super__List_base<CS248::Edge,_std::allocator<CS248::Edge>_>._M_impl._M_node._M_size
       = 0;
  plVar1 = &this->faces;
  std::__cxx11::_List_base<CS248::Face,_std::allocator<CS248::Face>_>::_M_clear
            (&plVar1->super__List_base<CS248::Face,_std::allocator<CS248::Face>_>);
  (this->faces).super__List_base<CS248::Face,_std::allocator<CS248::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->faces).super__List_base<CS248::Face,_std::allocator<CS248::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->faces).super__List_base<CS248::Face,_std::allocator<CS248::Face>_>._M_impl._M_node._M_size
       = 0;
  plVar1 = &this->boundaries;
  std::__cxx11::_List_base<CS248::Face,_std::allocator<CS248::Face>_>::_M_clear
            (&plVar1->super__List_base<CS248::Face,_std::allocator<CS248::Face>_>);
  (this->boundaries).super__List_base<CS248::Face,_std::allocator<CS248::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->boundaries).super__List_base<CS248::Face,_std::allocator<CS248::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->boundaries).super__List_base<CS248::Face,_std::allocator<CS248::Face>_>._M_impl._M_node.
  _M_size = 0;
  build(this,polygons,vertexPositions);
  return;
}

Assistant:

void HalfedgeMesh::rebuild(const vector<vector<Index> >& polygons,
                           const vector<Vector3D>& vertexPositions) {
  // Clear old elements
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // Create new mesh
  build(polygons, vertexPositions);
}